

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

ssize_t libssh2_sftp_write(LIBSSH2_SFTP_HANDLE *hnd,char *buffer,size_t count)

{
  void **ppvVar1;
  LIBSSH2_SFTP *sftp;
  LIBSSH2_SESSION *pLVar2;
  LIBSSH2_CHANNEL *channel;
  int iVar3;
  uint32_t uVar4;
  list_node *plVar5;
  list_node *plVar6;
  void *pvVar7;
  list_node *plVar8;
  char *pcVar9;
  char *pcVar10;
  ssize_t sStack_a0;
  uchar *local_80;
  list_head *local_78;
  uchar *s;
  char *local_68;
  size_t data_len;
  char *local_58;
  LIBSSH2_CHANNEL *local_50;
  time_t local_48;
  char *local_40;
  list_node *local_38;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    sStack_a0 = -0x27;
  }
  else {
    local_68 = (char *)count;
    local_58 = buffer;
    local_48 = time((time_t *)0x0);
    local_40 = hnd->handle;
    local_78 = &hnd->packet_list;
    do {
      sftp = hnd->sftp;
      pLVar2 = sftp->channel->session;
      data_len = 0;
      local_80 = (uchar *)0x0;
      if (sftp->write_state != libssh2_NB_state_sent) {
        sftp->last_errno = 0;
        pcVar9 = (hnd->u).dir.next_name + ((long)(hnd->u).dir.names_packet - (hnd->u).file.offset);
        sftp->write_state = libssh2_NB_state_idle;
        plVar8 = (list_node *)(local_68 + -(long)pcVar9);
        if (local_68 < pcVar9) {
          plVar8 = (list_node *)0x0;
          pcVar9 = (char *)0x0;
        }
        pcVar9 = local_58 + (long)pcVar9;
        local_50 = sftp->channel;
        while (plVar8 != (list_node *)0x0) {
          plVar5 = (list_node *)0x7530;
          if (plVar8 < (list_node *)0x7530) {
            plVar5 = plVar8;
          }
          iVar3 = (int)hnd->handle_len + (int)plVar5;
          plVar6 = (list_node *)(ulong)(iVar3 + 0x19);
          local_38 = plVar8;
          plVar8 = (list_node *)(*pLVar2->alloc)((size_t)&plVar6[2].head,&pLVar2->abstract);
          if (plVar8 == (list_node *)0x0) {
            iVar3 = _libssh2_error(pLVar2,-6,"malloc fail for FXP_WRITE");
            pcVar9 = (char *)(long)iVar3;
            goto LAB_00123b2a;
          }
          plVar8[1].prev = plVar5;
          plVar8[1].head = (list_head *)0x0;
          plVar8[2].next = plVar6;
          s = (uchar *)((long)&plVar8[2].prev + 4);
          _libssh2_store_u32(&s,iVar3 + 0x15);
          *s = '\x06';
          uVar4 = sftp->request_id;
          sftp->request_id = uVar4 + 1;
          *(uint32_t *)&plVar8[2].prev = uVar4;
          s = s + 1;
          _libssh2_store_u32(&s,uVar4);
          _libssh2_store_str(&s,local_40,hnd->handle_len);
          _libssh2_store_u64(&s,(hnd->u).file.offset_sent);
          ppvVar1 = &(hnd->u).dir.names_packet;
          *ppvVar1 = (void *)((long)&plVar5->next + (long)*ppvVar1);
          _libssh2_store_str(&s,pcVar9,(size_t)plVar5);
          _libssh2_list_add(local_78,plVar8);
          pcVar9 = pcVar9 + (long)plVar5;
          plVar8 = (list_node *)((long)local_38 - (long)plVar5);
        }
        plVar8 = (list_node *)_libssh2_list_first(local_78);
        channel = local_50;
        for (; plVar8 != (list_node *)0x0; plVar8 = (list_node *)_libssh2_list_next(plVar8)) {
          if (plVar8[2].next != (list_node *)0x0) {
            pcVar9 = (char *)_libssh2_channel_write
                                       (channel,0,
                                        (uchar *)((long)&plVar8[1].head[3].first +
                                                 (long)((long)&plVar8->next + 4)),
                                        (size_t)plVar8[2].next);
            if ((long)pcVar9 < 0) goto LAB_00123b2a;
            plVar8[1].head = (list_head *)((long)&(plVar8[1].head)->last + (long)pcVar9);
            plVar5 = plVar8 + 2;
            plVar5->next = (list_node *)((long)plVar5->next - (long)pcVar9);
            if (plVar5->next != (list_node *)0x0) break;
          }
        }
      }
      sftp->write_state = libssh2_NB_state_idle;
      plVar5 = (list_node *)_libssh2_list_first(local_78);
      plVar8 = (list_node *)0x0;
      while ((plVar5 != (list_node *)0x0 &&
             (plVar5[2].next == (list_node *)0x0 && plVar8 == (list_node *)0x0))) {
        iVar3 = sftp_packet_require(sftp,'e',*(uint32_t *)&plVar5[2].prev,&local_80,&data_len,9);
        if (iVar3 == -0x26) {
          if (data_len != 0) {
            (*pLVar2->free)(local_80,&pLVar2->abstract);
          }
          pcVar9 = "FXP write packet too short";
LAB_00123b23:
          iVar3 = _libssh2_error(pLVar2,-0x1f,pcVar9);
LAB_00123b28:
          pcVar9 = (char *)(long)iVar3;
          goto LAB_00123b2a;
        }
        if (iVar3 < 0) {
          if (iVar3 != -0x25) goto LAB_00123b28;
          sftp->write_state = libssh2_NB_state_sent;
          goto LAB_00123b30;
        }
        uVar4 = _libssh2_ntohu32(local_80 + 5);
        (*pLVar2->free)(local_80,&pLVar2->abstract);
        sftp->last_errno = uVar4;
        if (uVar4 != 0) {
          sftp_packetlist_flush(hnd);
          pvVar7 = (void *)((hnd->u).file.offset - (hnd->u).file.acked);
          (hnd->u).file.offset = (libssh2_uint64_t)pvVar7;
          (hnd->u).dir.names_packet = pvVar7;
          (hnd->u).file.acked = 0;
          pcVar9 = "FXP write failed";
          goto LAB_00123b23;
        }
        plVar8 = plVar5[1].prev;
        (hnd->u).file.offset = (long)&plVar8->next + (hnd->u).file.offset;
        plVar6 = (list_node *)_libssh2_list_next(plVar5);
        _libssh2_list_remove(plVar5);
        (*pLVar2->free)(plVar5,&pLVar2->abstract);
        plVar5 = plVar6;
      }
      pcVar10 = (char *)((long)&plVar8->next + (long)(hnd->u).dir.next_name);
      if (pcVar10 == (char *)0x0) {
        return 0;
      }
      pcVar9 = local_68;
      if (pcVar10 < local_68) {
        pcVar9 = pcVar10;
      }
      (hnd->u).dir.next_name = pcVar10 + -(long)pcVar9;
LAB_00123b2a:
      if (pcVar9 != (char *)0xffffffffffffffdb) {
        return (ssize_t)pcVar9;
      }
LAB_00123b30:
      pLVar2 = hnd->sftp->channel->session;
      if ((pLVar2 == (LIBSSH2_SESSION *)0x0) || (pLVar2->api_block_mode == 0)) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar2,local_48);
    } while (iVar3 == 0);
    sStack_a0 = (ssize_t)iVar3;
  }
  return sStack_a0;
}

Assistant:

static ssize_t sftp_write(LIBSSH2_SFTP_HANDLE *handle, const char *buffer,
                          size_t count)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    uint32_t retcode;
    uint32_t packet_len;
    unsigned char *s, *data = NULL;
    ssize_t rc;
    struct sftp_pipeline_chunk *chunk;
    struct sftp_pipeline_chunk *next;
    size_t acked = 0;
    size_t org_count = count;
    size_t already;

    switch(sftp->write_state) {
    default:
    case libssh2_NB_state_idle:
        sftp->last_errno = LIBSSH2_FX_OK;

        /* Number of bytes sent off that haven't been acked and therefore we
           will get passed in here again.

           Also, add up the number of bytes that actually already have been
           acked but we haven't been able to return as such yet, so we will
           get that data as well passed in here again.
        */
        already = (size_t)(handle->u.file.offset_sent -
                           handle->u.file.offset)+
            handle->u.file.acked;

        if(count >= already) {
            /* skip the part already made into packets */
            buffer += already;
            count -= already;
        }
        else
            /* there is more data already fine than what we got in this call */
            count = 0;

        sftp->write_state = libssh2_NB_state_idle;
        while(count) {
            /* TODO: Possibly this should have some logic to prevent a very
               very small fraction to be left but lets ignore that for now */
            uint32_t size =
                (uint32_t)(LIBSSH2_MIN(MAX_SFTP_OUTGOING_SIZE, count));
            uint32_t request_id;

            /* 25 = packet_len(4) + packet_type(1) + request_id(4) +
               handle_len(4) + offset(8) + count(4) */
            packet_len = (uint32_t)(handle->handle_len + size + 25);

            chunk = LIBSSH2_ALLOC(session, packet_len +
                                  sizeof(struct sftp_pipeline_chunk));
            if(!chunk)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "malloc fail for FXP_WRITE");

            chunk->len = size;
            chunk->sent = 0;
            chunk->lefttosend = packet_len;

            s = chunk->packet;
            _libssh2_store_u32(&s, packet_len - 4);

            *(s++) = SSH_FXP_WRITE;
            request_id = sftp->request_id++;
            chunk->request_id = request_id;
            _libssh2_store_u32(&s, request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            _libssh2_store_u64(&s, handle->u.file.offset_sent);
            handle->u.file.offset_sent += size; /* advance offset at once */
            _libssh2_store_str(&s, buffer, size);

            /* add this new entry LAST in the list */
            _libssh2_list_add(&handle->packet_list, &chunk->node);

            buffer += size;
            count -= size; /* deduct the size we used, as we might have
                              to create more packets */
        }

        /* move through the WRITE packets that haven't been sent and send as
           many as possible - remember that we don't block */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend) {
                rc = _libssh2_channel_write(channel, 0,
                                            &chunk->packet[chunk->sent],
                                            chunk->lefttosend);
                if(rc < 0)
                    /* remain in idle state */
                    return rc;

                /* remember where to continue sending the next time */
                chunk->lefttosend -= rc;
                chunk->sent += rc;

                if(chunk->lefttosend)
                    /* data left to send, get out of loop */
                    break;
            }

            /* move on to the next chunk with data to send */
            chunk = _libssh2_list_next(&chunk->node);
        }

        LIBSSH2_FALLTHROUGH();

    case libssh2_NB_state_sent:

        sftp->write_state = libssh2_NB_state_idle;
        /*
         * Count all ACKed packets
         */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend)
                /* if the chunk still has data left to send, we shouldn't wait
                   for an ACK for it just yet */
                break;

            else if(acked)
                /* if we have sent data that is acked, we must return that
                   info before we call a function that might return EAGAIN */
                break;

            /* we check the packets in order */
            rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                                     chunk->request_id, &data, &data_len, 9);
            if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                if(data_len > 0) {
                    LIBSSH2_FREE(session, data);
                }
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "FXP write packet too short");
            }
            else if(rc < 0) {
                if(rc == LIBSSH2_ERROR_EAGAIN)
                    sftp->write_state = libssh2_NB_state_sent;
                return rc;
            }

            retcode = _libssh2_ntohu32(data + 5);
            LIBSSH2_FREE(session, data);

            sftp->last_errno = retcode;
            if(retcode == LIBSSH2_FX_OK) {
                acked += chunk->len; /* number of payload data that was acked
                                        here */

                /* we increase the offset value for all acks */
                handle->u.file.offset += chunk->len;

                next = _libssh2_list_next(&chunk->node);

                _libssh2_list_remove(&chunk->node); /* remove from list */
                LIBSSH2_FREE(session, chunk); /* free memory */

                chunk = next;
            }
            else {
                /* flush all pending packets from the outgoing list */
                sftp_packetlist_flush(handle);

                /* since we return error now, the application will not get any
                   outstanding data acked, so we need to rewind the offset to
                   where the application knows it has reached with acked
                   data */
                handle->u.file.offset -= handle->u.file.acked;

                /* then reset the offset_sent to be the same as the offset */
                handle->u.file.offset_sent = handle->u.file.offset;

                /* clear the acked counter since we can have no pending data to
                   ack after an error */
                handle->u.file.acked = 0;

                /* the server returned an error for that written chunk,
                   propagate this back to our parent function */
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "FXP write failed");
            }
        }
        break;
    }

    /* if there were acked data in a previous call that wasn't returned then,
       add that up and try to return it all now. This can happen if the app
       first sends a huge buffer of data, and then in a second call it sends a
       smaller one. */
    acked += handle->u.file.acked;

    if(acked) {
        ssize_t ret = LIBSSH2_MIN(acked, org_count);
        /* we got data acked so return that amount, but no more than what
           was asked to get sent! */

        /* store the remainder. 'ret' is always equal to or less than 'acked'
           here */
        handle->u.file.acked = acked - ret;

        return ret;
    }

    else
        return 0; /* nothing was acked, and no EAGAIN was received! */
}